

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapMerge.c
# Opt level: O0

void Amap_ManMerge(Amap_Man_t *p)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  abctime aVar7;
  Amap_Cut_t *pAVar8;
  Amap_Obj_t *pObj_00;
  abctime aVar9;
  abctime clk;
  int i;
  Amap_Obj_t *pObj;
  Amap_Man_t *p_local;
  
  aVar7 = Abc_Clock();
  pAVar8 = Amap_ManSetupPis(p);
  p->pCutsPi = pAVar8;
  for (clk._4_4_ = 0; iVar4 = Vec_PtrSize(p->vObjs), clk._4_4_ < iVar4; clk._4_4_ = clk._4_4_ + 1) {
    pObj_00 = (Amap_Obj_t *)Vec_PtrEntry(p->vObjs,clk._4_4_);
    if ((pObj_00 != (Amap_Obj_t *)0x0) && (iVar4 = Amap_ObjIsNode(pObj_00), iVar4 != 0)) {
      Amap_ManMergeNodeCuts(p,pObj_00);
    }
  }
  if (p->pPars->fVerbose != 0) {
    printf("AIG object is %d bytes.  ",0x58);
    iVar4 = Amap_ManObjNum(p);
    printf("Internal AIG = %5.2f MB.  Cuts = %5.2f MB.  CutsMax = %d.\n",
           ((double)iVar4 * 1.0 * 88.0) / 1048576.0,((double)p->nBytesUsed * 1.0) / 1048576.0,
           (ulong)(uint)p->pPars->nCutsMax);
    uVar5 = Amap_ManNodeNum(p);
    uVar1 = p->nCutsTried;
    uVar2 = p->nCutsTried3;
    uVar3 = p->nCutsUsed;
    iVar4 = p->nCutsUsed;
    iVar6 = Amap_ManNodeNum(p);
    printf("Node =%6d. Try =%9d. Try3 =%10d. Used =%7d. R =%6.2f.  ",
           ((double)iVar4 * 1.0) / (double)iVar6,(ulong)uVar5,(ulong)uVar1,(ulong)uVar2,(ulong)uVar3
          );
    Abc_Print(1,"%s =","Time ");
    aVar9 = Abc_Clock();
    Abc_Print(1,"%9.2f sec\n",((double)(aVar9 - aVar7) * 1.0) / 1000000.0);
  }
  return;
}

Assistant:

void Amap_ManMerge( Amap_Man_t * p )
{
    Amap_Obj_t * pObj;
    int i;
    abctime clk = Abc_Clock();
    p->pCutsPi = Amap_ManSetupPis( p );
    Amap_ManForEachNode( p, pObj, i )
        Amap_ManMergeNodeCuts( p, pObj );
    if ( p->pPars->fVerbose )
    {
        printf( "AIG object is %d bytes.  ", (int)sizeof(Amap_Obj_t) );
        printf( "Internal AIG = %5.2f MB.  Cuts = %5.2f MB.  CutsMax = %d.\n", 
            1.0*Amap_ManObjNum(p)*sizeof(Amap_Obj_t)/(1<<20), 1.0*p->nBytesUsed/(1<<20), p->pPars->nCutsMax );
        printf( "Node =%6d. Try =%9d. Try3 =%10d. Used =%7d. R =%6.2f.  ", 
            Amap_ManNodeNum(p), p->nCutsTried, p->nCutsTried3, p->nCutsUsed, 
            1.0*p->nCutsUsed/Amap_ManNodeNum(p) );
ABC_PRT( "Time ", Abc_Clock() - clk );
    }
}